

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

PipelineResourceSignatureImplType * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,Uint32 Index)

{
  char (*in_RCX) [25];
  string msg;
  string local_38;
  
  CheckPipelineReady(this);
  if (this->m_SignatureCount <= Index) {
    FormatString<char[26],char[25]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index < m_SignatureCount",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetResourceSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x2d7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return this->m_Signatures[Index].m_pObject;
}

Assistant:

GetResourceSignature(Uint32 Index) const override final
    {
        CheckPipelineReady();
        VERIFY_EXPR(Index < m_SignatureCount);
        return m_Signatures[Index];
    }